

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_iplusn(LispPTR tos,int n)

{
  ulong uVar1;
  ushort uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (ulong)tos;
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar4 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    uVar4 = tos & 0xffff;
  }
  else {
    uVar2 = *(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar2 == 3) {
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      if (*(float *)(Lisp_world + uVar1) != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      uVar4 = (uint)*(float *)(Lisp_world + uVar1);
    }
    else {
      if (uVar2 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      uVar4 = *(uint *)(Lisp_world + uVar1);
    }
  }
  uVar5 = uVar4 + n;
  if (SCARRY4(uVar4,n)) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = tos;
    return 0xffffffff;
  }
  if ((uVar5 & 0xffff0000) != 0xffff0000) {
    if ((uVar5 & 0xffff0000) != 0) {
      puVar3 = (uint *)createcell68k(2);
      *puVar3 = uVar5;
      if (((ulong)puVar3 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar3);
      }
      return (LispPTR)((ulong)((long)puVar3 - (long)Lisp_world) >> 1);
    }
    return uVar5 | 0xe0000;
  }
  return uVar5 & 0xffff | 0xf0000;
}

Assistant:

LispPTR N_OP_iplusn(LispPTR tos, int n) {
  int arg1;
  int result;

  N_IGETNUMBER(tos, arg1, do_ufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, n, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else

  result = arg1 + n;
  if ((result < 0) && (arg1 >= 0)) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

do_ufn:
  ERROR_EXIT(tos);
}